

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

void mt_destroy(mtaux_t *mt)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  long lVar2;
  long lVar3;
  
  __mutex = &mt->lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  mt->done = 1;
  mt->proc_cnt = 0;
  pthread_cond_broadcast((pthread_cond_t *)&mt->cv);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  iVar1 = mt->n_threads;
  if (1 < iVar1) {
    lVar2 = 1;
    do {
      pthread_join(mt->tid[lVar2],(void **)0x0);
      lVar2 = lVar2 + 1;
      iVar1 = mt->n_threads;
    } while (lVar2 < iVar1);
  }
  if (0 < mt->n_blks) {
    lVar2 = 0;
    do {
      free(mt->blk[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < mt->n_blks);
    iVar1 = mt->n_threads;
  }
  if (0 < iVar1) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      free(*(void **)((long)&mt->w->mt + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < mt->n_threads);
  }
  free(mt->blk);
  free(mt->len);
  free(mt->w);
  free(mt->tid);
  pthread_cond_destroy((pthread_cond_t *)&mt->cv);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  free(mt);
  return;
}

Assistant:

static void mt_destroy(mtaux_t *mt)
{
    int i;
    // signal all workers to quit
    pthread_mutex_lock(&mt->lock);
    mt->done = 1; mt->proc_cnt = 0;
    pthread_cond_broadcast(&mt->cv);
    pthread_mutex_unlock(&mt->lock);
    for (i = 1; i < mt->n_threads; ++i) pthread_join(mt->tid[i], 0); // worker 0 is effectively launched by the master thread
    // free other data allocated on heap
    for (i = 0; i < mt->n_blks; ++i) free(mt->blk[i]);
    for (i = 0; i < mt->n_threads; ++i) free(mt->w[i].buf);
    free(mt->blk); free(mt->len); free(mt->w); free(mt->tid);
    pthread_cond_destroy(&mt->cv);
    pthread_mutex_destroy(&mt->lock);
    free(mt);
}